

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O0

void lrit::to_json(json *j,RiceCompressionHeader *h)

{
  initializer_list_t init;
  long in_RSI;
  char (*in_stack_fffffffffffffd28) [19];
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffd30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffd38;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffd40;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  in_stack_fffffffffffffd48;
  value_t in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffdc0;
  iterator in_stack_fffffffffffffdc8;
  size_type in_stack_fffffffffffffdd0;
  undefined1 **local_220;
  undefined1 **local_208;
  undefined1 **local_1f0;
  undefined1 **local_1d8;
  undefined1 *local_1b0 [8];
  undefined8 *local_170;
  undefined8 local_168;
  uint local_15c;
  undefined8 *local_158;
  undefined1 *local_150 [4];
  undefined1 local_130 [32];
  undefined8 *local_110;
  undefined8 local_108;
  uint local_100;
  undefined8 *local_f0;
  undefined1 *local_e8 [4];
  undefined1 local_c8 [32];
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined8 *local_98;
  undefined1 *local_90 [4];
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  undefined8 *local_30;
  undefined8 local_28;
  long local_10;
  
  local_98 = local_90;
  local_f0 = local_e8;
  local_10 = in_RSI;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[6]>(in_stack_fffffffffffffd30,(char (*) [6])in_stack_fffffffffffffd28);
  local_f0 = (undefined8 *)local_c8;
  local_100 = (uint)*(ushort *)(local_10 + 4);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffd30,(int *)in_stack_fffffffffffffd28);
  local_a8 = local_e8;
  local_a0 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffd40,in_stack_fffffffffffffd48);
  local_98 = (undefined8 *)local_70;
  local_158 = local_150;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[15]>(in_stack_fffffffffffffd30,(char (*) [15])in_stack_fffffffffffffd28);
  local_158 = (undefined8 *)local_130;
  local_15c = (uint)*(byte *)(local_10 + 6);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffd30,(int *)in_stack_fffffffffffffd28);
  local_110 = local_150;
  local_108 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffd40,in_stack_fffffffffffffd48);
  local_98 = (undefined8 *)local_50;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[19]>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffd30,(int *)in_stack_fffffffffffffd28);
  local_170 = local_1b0;
  local_168 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffd40,in_stack_fffffffffffffd48);
  local_30 = local_90;
  local_28 = 3;
  init._M_len = in_stack_fffffffffffffdd0;
  init._M_array = in_stack_fffffffffffffdc8;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(in_stack_fffffffffffffdc0,init,(bool)in_stack_fffffffffffffdbf,
               in_stack_fffffffffffffdbe);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(&in_stack_fffffffffffffd40->owned_value,in_stack_fffffffffffffd38);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&in_stack_fffffffffffffd30->owned_value);
  local_1d8 = (undefined1 **)&local_30;
  do {
    local_1d8 = local_1d8 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x2c84b5);
  } while (local_1d8 != local_90);
  local_1f0 = (undefined1 **)&local_170;
  do {
    local_1f0 = local_1f0 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x2c8507);
  } while (local_1f0 != local_1b0);
  local_208 = (undefined1 **)&local_110;
  do {
    local_208 = local_208 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x2c8559);
  } while (local_208 != local_150);
  local_220 = (undefined1 **)&local_a8;
  do {
    local_220 = local_220 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x2c85ab);
  } while (local_220 != local_e8);
  return;
}

Assistant:

void to_json(json& j, const RiceCompressionHeader& h) {
  j = {
      {"Flags", int(h.flags)},
      {"PixelsPerBlock", int(h.pixelsPerBlock)},
      {"ScanLinesPerPacket", int(h.scanLinesPerPacket)},
  };
}